

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommylist.c
# Opt level: O3

void tommy_list_sort(tommy_list *list,tommy_compare_func *cmp)

{
  tommy_list ptVar1;
  tommy_node_struct *ptVar2;
  tommy_node_struct *ptVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  ulong uVar13;
  tommy_list ptVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  tommy_list ptVar17;
  tommy_node_struct *ptVar18;
  tommy_node_struct *ptVar19;
  ulong uVar20;
  undefined8 *puVar21;
  tommy_node_struct *ptVar22;
  tommy_node_struct *ptVar23;
  long *plVar24;
  undefined8 *puVar25;
  tommy_node *first_i;
  tommy_node_struct *ptVar26;
  undefined8 *puVar27;
  uint uVar28;
  ulong uVar29;
  long in_FS_OFFSET;
  bool bVar30;
  undefined1 local_248 [512];
  tommy_list local_48;
  tommy_list ptStack_40;
  void *local_38;
  
  local_38 = *(void **)(in_FS_OFFSET + 0x28);
  ptVar17 = *list;
  if (ptVar17 != (tommy_list)0x0) {
    ptVar1 = ptVar17->prev;
    uVar29 = 0;
    do {
      ptVar22 = (tommy_node_struct *)&local_48;
      local_48 = ptVar17;
      ptStack_40 = ptVar17;
      ptVar2 = ptVar17->next;
      if ((uVar29 & 1) == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        uVar20 = uVar29;
        ptVar23 = ptVar22;
        do {
          ptVar22 = (tommy_node_struct *)(local_248 + uVar13 * 0x10);
          ptVar19 = ((tommy_node_struct *)(local_248 + (uVar13 * 4 + -1) * 4 + 0xc))->next;
          iVar12 = (*cmp)(ptVar19->data,ptVar23->next->data);
          if (iVar12 < 1) {
            ptVar26 = ptVar23->next;
            ptVar26->prev = ptVar19;
            ptVar19->next = ptVar26;
LAB_0010fce5:
            ptVar23 = (tommy_node_struct *)&ptVar23->prev;
            ptVar19 = (tommy_node_struct *)(local_248 + (uVar13 * 4 + -1) * 4 + 0xc);
LAB_0010fcfd:
            ptVar19->next = ptVar23->next;
          }
          else {
            ptVar26 = ptVar22->next;
            iVar12 = (*cmp)(ptVar23->prev->data,ptVar26->data);
            if (iVar12 < 0) {
              ptVar19 = ptVar23->prev;
              ptVar26->prev = ptVar19;
              ptVar19->next = ptVar26;
              ptVar19 = ptVar22;
              goto LAB_0010fcfd;
            }
            ptVar14 = ptVar23->next;
            do {
              while (iVar12 = (*cmp)(ptVar26->data,ptVar14->data), iVar12 < 1) {
                if (ptVar26 == ptVar19) {
                  ptVar14->prev = ptVar26;
                  ptVar26->next = ptVar14;
                  goto LAB_0010fce5;
                }
                ptVar26 = ptVar26->next;
              }
              ptVar3 = ptVar14->next;
              if (ptVar26 == ptVar22->next) {
                ptVar26->prev = ptVar14;
                ptVar18 = ptVar22;
              }
              else {
                ptVar18 = ptVar26->prev;
                ptVar26->prev = ptVar14;
                ptVar14->prev = ptVar18;
              }
              ptVar18->next = ptVar14;
              ptVar14->next = ptVar26;
              bVar30 = ptVar14 != ptVar23->prev;
              ptVar14 = ptVar3;
            } while (bVar30);
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          uVar8 = uVar20 & 2;
          uVar20 = uVar20 >> 1;
          ptVar23 = ptVar22;
        } while (uVar8 != 0);
      }
      uVar9 = *(undefined4 *)((long)&ptVar22->next + 4);
      uVar10 = *(undefined4 *)&ptVar22->prev;
      uVar11 = *(undefined4 *)((long)&ptVar22->prev + 4);
      *(undefined4 *)(local_248 + uVar13 * 0x10) = *(undefined4 *)&ptVar22->next;
      *(undefined4 *)(local_248 + uVar13 * 0x10 + 4) = uVar9;
      *(undefined4 *)(local_248 + (uVar13 * 4 + -1) * 4 + 0xc) = uVar10;
      *(undefined4 *)(local_248 + uVar13 * 0x10 + 0xc) = uVar11;
      uVar28 = (int)uVar29 + 1;
      uVar29 = (ulong)uVar28;
      bVar30 = ptVar17 != ptVar1;
      ptVar17 = ptVar2;
    } while (bVar30);
    uVar7 = 0;
    if (uVar28 != 0) {
      for (; (uVar28 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
      }
    }
    uVar28 = uVar28 >> ((byte)uVar7 & 0x1f);
    uVar29 = (ulong)uVar28;
    uVar20 = (ulong)uVar7;
    if (uVar28 == 1) {
      uVar13 = (ulong)uVar7;
    }
    else {
      do {
        uVar13 = (ulong)((int)uVar20 + 1);
        puVar15 = (undefined8 *)(local_248 + uVar13 * 0x10);
        puVar27 = (undefined8 *)(local_248 + uVar20 * 0x10);
        if ((uVar29 & 2) == 0) {
          uVar9 = *(undefined4 *)(local_248 + uVar20 * 0x10 + 4);
          uVar10 = *(undefined4 *)(local_248 + (uVar20 * 4 + -1) * 4 + 0xc);
          uVar11 = *(undefined4 *)(local_248 + uVar20 * 0x10 + 0xc);
          *(undefined4 *)puVar15 = *(undefined4 *)puVar27;
          *(undefined4 *)(local_248 + uVar13 * 0x10 + 4) = uVar9;
          *(undefined4 *)(local_248 + (uVar13 * 4 + -1) * 4 + 0xc) = uVar10;
          *(undefined4 *)(local_248 + uVar13 * 0x10 + 0xc) = uVar11;
        }
        else {
          puVar25 = (undefined8 *)(local_248 + (uVar13 * 4 + -1) * 4 + 0xc);
          plVar4 = *(long **)(local_248 + (uVar13 * 4 + -1) * 4 + 0xc);
          puVar21 = (undefined8 *)*puVar27;
          iVar12 = (*cmp)((void *)plVar4[2],(void *)puVar21[2]);
          if (iVar12 < 1) {
            puVar21[1] = plVar4;
            *plVar4 = (long)puVar21;
            puVar27 = (undefined8 *)(local_248 + (uVar20 * 4 + -1) * 4 + 0xc);
          }
          else {
            puVar5 = *(undefined8 **)(local_248 + (uVar20 * 4 + -1) * 4 + 0xc);
            plVar24 = (long *)*puVar15;
            iVar12 = (*cmp)((void *)puVar5[2],(void *)plVar24[2]);
            if (-1 < iVar12) {
              puVar27 = (undefined8 *)(local_248 + (uVar20 * 4 + -1) * 4 + 0xc);
              do {
                while (iVar12 = (*cmp)((void *)plVar24[2],(void *)puVar21[2]), iVar12 < 1) {
                  if (plVar24 == plVar4) {
                    puVar21[1] = plVar24;
                    *plVar24 = (long)puVar21;
                    goto LAB_0010fea3;
                  }
                  plVar24 = (long *)*plVar24;
                }
                puVar6 = (undefined8 *)*puVar21;
                if (plVar24 == (long *)*puVar15) {
                  plVar24[1] = (long)puVar21;
                  puVar16 = puVar15;
                }
                else {
                  puVar16 = (undefined8 *)plVar24[1];
                  plVar24[1] = (long)puVar21;
                  puVar21[1] = puVar16;
                }
                *puVar16 = puVar21;
                *puVar21 = plVar24;
                bVar30 = puVar21 != puVar5;
                puVar21 = puVar6;
              } while (bVar30);
              goto LAB_0010feab;
            }
            plVar24[1] = (long)puVar5;
            *puVar5 = plVar24;
            puVar25 = puVar15;
          }
LAB_0010fea3:
          *puVar25 = *puVar27;
        }
LAB_0010feab:
        uVar29 = uVar29 >> 1;
        uVar20 = uVar13;
      } while ((int)uVar29 != 1);
    }
    ptVar17 = *(tommy_list *)(local_248 + uVar13 * 0x10);
    ptVar22 = *(tommy_node_struct **)(local_248 + (uVar13 * 4 + -1) * 4 + 0xc);
    ptVar17->prev = ptVar22;
    ptVar22->next = (tommy_node_struct *)0x0;
    *list = ptVar17;
  }
  if (*(void **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_list_sort(tommy_list* list, tommy_compare_func* cmp)
{
	tommy_chain chain;
	tommy_node* head;

	if (tommy_list_empty(list))
		return;

	head = tommy_list_head(list);

	/* create a chain from the list */
	chain.head = head;
	chain.tail = head->prev;

	tommy_chain_mergesort(&chain, cmp);

	/* restore the list */
	tommy_list_set(list, chain.head, chain.tail);
}